

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  Table *pTVar1;
  VTable *pVVar2;
  _func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *p_Var3;
  char *__s;
  undefined3 uVar4;
  u32 uVar5;
  int iVar6;
  VTable **ppVVar7;
  size_t sVar8;
  FuncDef *pFVar9;
  long lVar10;
  u64 n;
  FuncDef *pFVar11;
  FuncDef *pFVar12;
  byte bVar13;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  void *local_28;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_20;
  
  bVar13 = 0;
  local_20 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_28 = (void *)0x0;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0xa2)) &&
      (pTVar1 = (pExpr->y).pTab, pTVar1 != (Table *)0x0)) && (pTVar1->nModuleArg != 0)) {
    ppVVar7 = &pTVar1->pVTable;
    do {
      pVVar2 = *ppVVar7;
      ppVVar7 = &pVVar2->pNext;
    } while (pVVar2->db != db);
    p_Var3 = pVVar2->pVtab->pModule->xFindFunction;
    if ((p_Var3 != (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
       (iVar6 = (*p_Var3)(pVVar2->pVtab,nArg,pDef->zName,&local_20,&local_28), iVar6 != 0)) {
      if (pDef->zName == (char *)0x0) {
        n = 0x49;
      }
      else {
        sVar8 = strlen(pDef->zName);
        n = (ulong)((uint)sVar8 & 0x3fffffff) + 0x49;
      }
      pFVar9 = (FuncDef *)sqlite3DbMallocZero(db,n);
      if (pFVar9 != (FuncDef *)0x0) {
        pFVar11 = pDef;
        pFVar12 = pFVar9;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          uVar4 = *(undefined3 *)&pFVar11->field_0x1;
          uVar5 = pFVar11->funcFlags;
          pFVar12->nArg = pFVar11->nArg;
          *(undefined3 *)&pFVar12->field_0x1 = uVar4;
          pFVar12->funcFlags = uVar5;
          pFVar11 = (FuncDef *)((long)pFVar11 + (ulong)bVar13 * -0x10 + 8);
          pFVar12 = (FuncDef *)((long)pFVar12 + (ulong)bVar13 * -0x10 + 8);
        }
        pFVar9->zName = &pFVar9[1].nArg;
        __s = pDef->zName;
        if (__s == (char *)0x0) {
          sVar8 = 1;
        }
        else {
          sVar8 = strlen(__s);
          sVar8 = (ulong)((uint)sVar8 & 0x3fffffff) + 1;
        }
        memcpy(pFVar9 + 1,__s,sVar8);
        pFVar9->xSFunc = local_20;
        pFVar9->pUserData = local_28;
        *(byte *)&pFVar9->funcFlags = (byte)pFVar9->funcFlags | 0x10;
        pDef = pFVar9;
      }
    }
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;

  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  pTab = pExpr->y.pTab;
  if( pTab==0 ) return pDef;
  if( !IsVirtual(pTab) ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;
 
  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function.
  **
  ** Though undocumented, we have historically always invoked xFindFunction
  ** with an all lower-case function name.  Continue in this tradition to
  ** avoid any chance of an incompatibility.
  */
#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=0; pDef->zName[i]; i++){
      unsigned char x = (unsigned char)pDef->zName[i];
      assert( x==sqlite3UpperToLower[x] );
    }
  }
#endif
  rc = pMod->xFindFunction(pVtab, nArg, pDef->zName, &xSFunc, &pArg);
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (const char*)&pNew[1];
  memcpy((char*)&pNew[1], pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xSFunc = xSFunc;
  pNew->pUserData = pArg;
  pNew->funcFlags |= SQLITE_FUNC_EPHEM;
  return pNew;
}